

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall
QPDFJob::processFile
          (QPDFJob *this,unique_ptr<QPDF,_std::default_delete<QPDF>_> *pdf,char *filename,
          char *password,bool used_for_input,bool main_input)

{
  function<void_(QPDF_*,_const_char_*)> local_68;
  _Bind<std::_Mem_fn<void_(QPDF::*)(const_char_*,_const_char_*)>_(std::_Placeholder<1>,_const_char_*,_std::_Placeholder<2>)>
  local_48;
  
  local_48._M_f.super__Mem_fn_base<void_(QPDF::*)(const_char_*,_const_char_*),_true>._M_pmf =
       (offset_in_QPDF_to_subr)QPDF::processFile;
  local_48._M_f.super__Mem_fn_base<void_(QPDF::*)(const_char_*,_const_char_*),_true>._8_8_ = 0;
  local_48._M_bound_args.
  super__Tuple_impl<0UL,_std::_Placeholder<1>,_const_char_*,_std::_Placeholder<2>_>.
  super__Tuple_impl<1UL,_const_char_*,_std::_Placeholder<2>_>.
  super__Head_base<1UL,_const_char_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_std::_Placeholder<1>,_const_char_*,_std::_Placeholder<2>_>)
       (_Tuple_impl<0UL,_std::_Placeholder<1>,_const_char_*,_std::_Placeholder<2>_>)filename;
  std::function<void(QPDF*,char_const*)>::
  function<std::_Bind<std::_Mem_fn<void(QPDF::*)(char_const*,char_const*)>(std::_Placeholder<1>,char_const*,std::_Placeholder<2>)>&,void>
            ((function<void(QPDF*,char_const*)> *)&local_68,&local_48);
  doProcess(this,pdf,&local_68,password,*filename == '\0',used_for_input,main_input);
  std::_Function_base::~_Function_base(&local_68.super__Function_base);
  return;
}

Assistant:

void
QPDFJob::processFile(
    std::unique_ptr<QPDF>& pdf,
    char const* filename,
    char const* password,
    bool used_for_input,
    bool main_input)
{
    auto f1 = std::mem_fn<void(char const*, char const*)>(&QPDF::processFile);
    auto fn = std::bind(f1, std::placeholders::_1, filename, std::placeholders::_2);
    doProcess(pdf, fn, password, strcmp(filename, "") == 0, used_for_input, main_input);
}